

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O3

int cgltf_parse_json_unprocessed_extensions
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_size *out_extensions_count,cgltf_extension **out_extensions)

{
  cgltf_extension *__s;
  int i_00;
  cgltf_size cVar1;
  int iVar2;
  
  if ((tokens[(long)i + 1].type == JSMN_OBJECT) && (*out_extensions == (cgltf_extension *)0x0)) {
    iVar2 = tokens[(long)i + 1].size;
    *out_extensions_count = 0;
    if (-1 < (long)iVar2) {
      cVar1 = (long)iVar2 << 4;
      __s = (cgltf_extension *)(*(options->memory).alloc)((options->memory).user_data,cVar1);
      if (__s != (cgltf_extension *)0x0) {
        memset(__s,0,cVar1);
        *out_extensions = __s;
        i_00 = i + 2;
        while( true ) {
          if (iVar2 == 0) {
            return i_00;
          }
          iVar2 = iVar2 + -1;
          if ((tokens[i_00].type != JSMN_STRING) || (tokens[i_00].size == 0)) break;
          cVar1 = *out_extensions_count;
          *out_extensions_count = cVar1 + 1;
          i_00 = cgltf_parse_json_unprocessed_extension
                           (options,tokens,i_00,json_chunk,*out_extensions + cVar1);
          if (i_00 < 0) {
            return i_00;
          }
        }
        goto LAB_00116a65;
      }
    }
    *out_extensions = (cgltf_extension *)0x0;
    iVar2 = -2;
  }
  else {
LAB_00116a65:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int cgltf_parse_json_unprocessed_extensions(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_size* out_extensions_count, cgltf_extension** out_extensions)
{
	++i;

	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);
	if(*out_extensions)
	{
		return CGLTF_ERROR_JSON;
	}

	int extensions_size = tokens[i].size;
	*out_extensions_count = 0;
	*out_extensions = (cgltf_extension*)cgltf_calloc(options, sizeof(cgltf_extension), extensions_size);

	if (!*out_extensions)
	{
		return CGLTF_ERROR_NOMEM;
	}

	++i;

	for (int j = 0; j < extensions_size; ++j)
	{
		CGLTF_CHECK_KEY(tokens[i]);

		cgltf_size extension_index = (*out_extensions_count)++;
		cgltf_extension* extension = &((*out_extensions)[extension_index]);
		i = cgltf_parse_json_unprocessed_extension(options, tokens, i, json_chunk, extension);

		if (i < 0)
		{
			return i;
		}
	}
	return i;
}